

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O1

void __thiscall deci::dictionary_t::Insert(dictionary_t *this,dictionary_t *src)

{
  iterator iVar1;
  undefined8 uVar2;
  _Hash_node_base *p_Var3;
  value_type el;
  key_type local_48;
  _Hash_node_base *p_Stack_40;
  undefined8 local_38;
  undefined8 local_30;
  
  p_Var3 = (src->storage)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      local_48 = (key_type)p_Var3[1]._M_nxt;
      p_Stack_40 = p_Var3[2]._M_nxt;
      iVar1 = std::
              _Hashtable<deci::value_t_*,_std::pair<deci::value_t_*const,_deci::value_t_*>,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>,_std::__detail::_Select1st,_deci::value_equal_to_t,_deci::value_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->storage)._M_h,&local_48);
      if (iVar1.super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>.
          _M_cur == (__node_type *)0x0) {
        uVar2 = (*(code *)((_Hash_node_base *)local_48->_vptr_value_t)[2]._M_nxt)();
        local_30 = (*(code *)p_Stack_40->_M_nxt[2]._M_nxt)();
        local_38 = uVar2;
        std::
        _Hashtable<deci::value_t*,std::pair<deci::value_t*const,deci::value_t*>,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>,std::__detail::_Select1st,deci::value_equal_to_t,deci::value_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<deci::value_t*,deci::value_t*>>
                  ((_Hashtable<deci::value_t*,std::pair<deci::value_t*const,deci::value_t*>,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>,std::__detail::_Select1st,deci::value_equal_to_t,deci::value_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->storage,&local_38);
      }
      else {
        (**(code **)(**(long **)((long)iVar1.
                                       super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                                       ._M_cur + 0x10) + 0x18))();
        uVar2 = (*(code *)p_Stack_40->_M_nxt[2]._M_nxt)();
        *(undefined8 *)
         ((long)iVar1.
                super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>.
                _M_cur + 0x10) = uVar2;
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void dictionary_t::Insert(const dictionary_t& src) {
    for (auto el: src.storage) {
      storage_t::iterator it = this->storage.find(el.first);
      if (it == this->storage.end())
      {
        this->storage.insert(std::make_pair(el.first->Copy(), el.second->Copy()));
      }
      else
      {
        it->second->Delete();
        it->second = el.second->Copy();
      }
    }
  }